

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_region.cpp
# Opt level: O3

void __thiscall Region_Single_Test::~Region_Single_Test(Region_Single_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F (Region, Single) {
    constexpr std::size_t size = 32;

    auto sp = this->make_array (size);
    auto file = std::make_shared<pstore::file::in_memory> (sp, size, size);

    pstore::region::mem_based_factory factory (file, size, size);
    std::vector<std::shared_ptr<pstore::memory_mapper_base>> result = factory.init ();

    ASSERT_EQ (1U, result.size ());

    auto const & region0 = *(result.at (0));
    EXPECT_EQ (sp, region0.data ());
    EXPECT_EQ (0U, region0.offset ());
    EXPECT_EQ (size, region0.size ());
    EXPECT_TRUE (region0.is_writable ());
}